

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::anon_unknown_36::FailureTest::~FailureTest(FailureTest *this)

{
  FailureTest *in_RDI;
  
  ~FailureTest(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}